

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O0

char * DynamicProfileStorage::AllocRecord(DWORD bufferSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Memory *this;
  uint *puVar4;
  TrackAllocData local_40;
  char *buffer;
  DWORD bufferSize_local;
  
  buffer._4_4_ = bufferSize;
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x47e,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&char::typeinfo,0,(ulong)buffer._4_4_ + 4,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
             ,0x47f);
  this = (Memory *)
         Memory::NoCheckHeapAllocator::TrackAllocInfo
                   ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,&local_40);
  puVar4 = (uint *)Memory::AllocateArray<Memory::NoCheckHeapAllocator,char,false>
                             (this,(NoCheckHeapAllocator *)Memory::NoCheckHeapAllocator::Alloc,0,
                              (ulong)buffer._4_4_ + 4);
  if (puVar4 != (uint *)0x0) {
    *puVar4 = buffer._4_4_;
  }
  return (char *)puVar4;
}

Assistant:

char * DynamicProfileStorage::AllocRecord(DWORD bufferSize)
{
    AssertOrFailFast(enabled);
    char * buffer = NoCheckHeapNewArray(char, bufferSize + sizeof(DWORD));
    if (buffer != nullptr)
    {
        *(DWORD *)buffer = bufferSize;
    }
    return buffer;
}